

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O3

char * netaddr_to_prefixstring(netaddr_str *dst,netaddr *src,_Bool forceprefix)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  netaddr_str *pnVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  netaddr *pnVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  
  if (src != (netaddr *)0x0) {
    bVar2 = src->_type;
    if (bVar2 < 0x2f) {
      if (bVar2 == 2) {
        pnVar4 = (netaddr_str *)inet_ntop(2,src,dst->buf,0x3e);
        bVar2 = 0x20;
      }
      else {
        if (bVar2 != 10) goto LAB_00128e8d;
        pnVar4 = (netaddr_str *)inet_ntop(10,src,dst->buf,0x3e);
        bVar2 = 0x80;
      }
    }
    else {
      pnVar4 = dst;
      if (bVar2 == 0x2f) {
        lVar7 = 0;
        pnVar8 = src;
        do {
          dst->buf[lVar7] = "0123456789abcdef"[pnVar8->_addr[0] >> 4];
          dst->buf[lVar7 + 1] = "0123456789abcdef"[pnVar8->_addr[0] & 0xf];
          dst->buf[lVar7 + 2] = ':';
          pnVar8 = (netaddr *)(pnVar8->_addr + 1);
          lVar7 = lVar7 + 3;
        } while (lVar7 != 0x12);
        dst->buf[0x11] = '\0';
        bVar2 = 0x30;
      }
      else if (bVar2 == 0x30) {
        lVar7 = 0;
        pnVar8 = src;
        do {
          dst->buf[lVar7] = "0123456789abcdef"[pnVar8->_addr[0] >> 4];
          dst->buf[lVar7 + 1] = "0123456789abcdef"[pnVar8->_addr[0] & 0xf];
          dst->buf[lVar7 + 2] = '-';
          pnVar8 = (netaddr *)(pnVar8->_addr + 1);
          lVar7 = lVar7 + 3;
        } while (lVar7 != 0x18);
        dst->buf[0x17] = '\0';
        bVar2 = 0x40;
      }
      else {
        if (bVar2 != 0x31) goto LAB_00128e8d;
        uVar3 = 0x3e;
        uVar6 = 8;
        uVar9 = 4;
        lVar7 = 0;
        pnVar8 = src;
        pcVar10 = dst->buf;
        do {
          pcVar11 = pcVar10;
          if (2 < uVar3) {
            lVar13 = 0;
            uVar12 = uVar3;
            do {
              uVar12 = uVar12 - 2;
              *pcVar11 = "0123456789abcdef"[pnVar8->_addr[lVar13] >> 4];
              pcVar11[1] = "0123456789abcdef"[pnVar8->_addr[lVar13] & 0xf];
              pcVar11 = pcVar11 + 2;
              if (uVar9 - 1 == lVar13) break;
              lVar13 = lVar13 + 1;
            } while (2 < uVar12);
          }
          *pcVar11 = '\0';
          if (pcVar10 == (char *)0x0) break;
          if (lVar7 == 4) {
            bVar2 = 0;
            goto LAB_00128f58;
          }
          pnVar8 = (netaddr *)(pnVar8->_addr + uVar9);
          pcVar11 = pcVar10 + uVar6;
          pcVar10 = pcVar11 + 1;
          *pcVar11 = '-';
          uVar12 = ~uVar6;
          uVar6 = _uuid_from_string::max_group_len[lVar7 + 1];
          lVar7 = lVar7 + 1;
          uVar9 = uVar6 >> 1;
          uVar3 = uVar3 + uVar12;
        } while (uVar3 != 0);
        bVar2 = 0;
        pnVar4 = (netaddr_str *)0x0;
      }
    }
LAB_00128f58:
    bVar1 = src->_prefix_len;
    if (bVar1 < bVar2 || forceprefix) {
      sVar5 = strlen(pnVar4->buf);
      snprintf(dst->buf + sVar5,5,"/%d",(ulong)bVar1);
    }
    return pnVar4->buf;
  }
LAB_00128e8d:
  pcVar10 = strscpy(dst->buf,"-",0x3e);
  return pcVar10;
}

Assistant:

const char *
netaddr_to_prefixstring(struct netaddr_str *dst, const struct netaddr *src, bool forceprefix) {
  static const char *NONE = "-";
  const char *result = NULL;
  int maxprefix;

  if (!src) {
    return strscpy(dst->buf, NONE, sizeof(*dst));
  }

  maxprefix = netaddr_get_maxprefix(src);
  switch (src->_type) {
    case AF_INET:
      result = inet_ntop(AF_INET, src->_addr, dst->buf, sizeof(*dst));
      break;
    case AF_INET6:
      result = inet_ntop(AF_INET6, src->_addr, dst->buf, sizeof(*dst));
      break;
    case AF_MAC48:
      result = _mac_to_string(dst->buf, sizeof(*dst), src->_addr, 6, ':');
      break;
    case AF_EUI64:
      result = _mac_to_string(dst->buf, sizeof(*dst), src->_addr, 8, '-');
      break;
    case AF_UUID:
      result = _uuid_to_string(dst->buf, sizeof(*dst), src->_addr, 16);
      break;
    case AF_UNSPEC:
      /* fall through */
    default:
      return strscpy(dst->buf, NONE, sizeof(*dst));
  }
  if (forceprefix || src->_prefix_len < maxprefix) {
    /* append prefix */
    snprintf(dst->buf + strlen(result), 5, "/%d", src->_prefix_len);
  }
  return result;
}